

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
vo::ManagedImage<unsigned_short,_std::allocator<unsigned_short>_>::~ManagedImage
          (ManagedImage<unsigned_short,_std::allocator<unsigned_short>_> *this)

{
  ManagedImage<unsigned_short,_std::allocator<unsigned_short>_> *this_local;
  
  Deallocate(this);
  return;
}

Assistant:

inline ~ManagedImage() { Deallocate(); }